

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::PartialResponseService::request
          (PartialResponseService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  OwnPromiseNode node;
  void *pvVar3;
  undefined4 in_register_00000034;
  TransformPromiseNodeBase *this_00;
  PromiseArena *in_stack_00000010;
  AsyncInputStream local_58;
  OwnPromiseNode local_50;
  undefined1 local_48 [24];
  
  AsyncInputStream::readAllBytes(&local_58,(uint64_t)response);
  AVar2._vptr_AsyncInputStream = local_58._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)local_58._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_58._vptr_AsyncInputStream - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4460:15)>
               ::anon_class_16_2_1e9c3a7c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_00614ff8;
    *(_func_int ***)((long)pvVar3 + 0x3f0) = (_func_int **)CONCAT44(in_register_00000034,method);
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = in_stack_00000010;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    local_58._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_58._vptr_AsyncInputStream + -6);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4460:15)>
               ::anon_class_16_2_1e9c3a7c_for_func::operator());
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00614ff8;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember =
         (_func_int **)CONCAT44(in_register_00000034,method);
    AVar2._vptr_AsyncInputStream[-1] = (_func_int *)in_stack_00000010;
    AVar2._vptr_AsyncInputStream[-5] = (_func_int *)pPVar1;
  }
  local_48._0_8_ = &DAT_0048a171;
  local_48._8_8_ = &DAT_0048a1d0;
  local_48._16_8_ = &DAT_4c0000058b;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,&local_50,(SourceLocation *)local_48);
  node.ptr = local_50.ptr;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  AVar2._vptr_AsyncInputStream = local_58._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)local_58._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
    local_58._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo"_kjb);
      return promise.attach(kj::mv(body)).then([]() -> kj::Promise<void> {
        return KJ_EXCEPTION(FAILED, "failed");
      });
    });
  }